

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O1

void trstep(double *jac,double *sN,int N,double *dx,double *L,double *hess,double nlen,double *ioval
           ,double eps,double *step)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double *vec;
  double *vec_00;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_c8;
  
  dVar1 = *ioval;
  dVar12 = ioval[1];
  dVar2 = ioval[2];
  dVar13 = ioval[3];
  dVar14 = ioval[4];
  local_c8 = ioval[5];
  vec = (double *)malloc((long)N << 3);
  vec_00 = (double *)malloc((long)N << 3);
  if (nlen <= dVar1 * 1.5) {
    ioval[6] = 1.0;
    if (0 < N) {
      uVar6 = 0;
      do {
        step[uVar6] = sN[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)N != uVar6);
    }
    dVar12 = 0.0;
    if (dVar1 <= nlen) {
      nlen = dVar1;
      dVar12 = 0.0;
    }
  }
  else {
    ioval[6] = 0.0;
    if (0.0 < dVar12) {
      dVar12 = dVar12 - (((dVar2 - dVar1) + dVar13) * (dVar2 + dVar13)) / (dVar14 * dVar1);
    }
    if ((ioval[7] == 1.0) && (!NAN(ioval[7]))) {
      ioval[7] = 0.0;
      if (0 < N) {
        uVar6 = 0;
        do {
          vec[uVar6] = dx[uVar6] * dx[uVar6] * sN[uVar6];
          uVar6 = uVar6 + 1;
        } while ((uint)N != uVar6);
      }
      *vec_00 = *vec / *L;
      if (1 < N) {
        uVar6 = (ulong)(uint)N;
        pdVar7 = L + uVar6;
        uVar9 = 1;
        do {
          dVar13 = 0.0;
          uVar8 = 0;
          do {
            dVar13 = dVar13 + vec_00[uVar8] * pdVar7[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
          vec_00[uVar9] = (vec[uVar9] - dVar13) / L[uVar9 * uVar6 + uVar9];
          uVar9 = uVar9 + 1;
          pdVar7 = pdVar7 + uVar6;
        } while (uVar9 != uVar6);
      }
      dVar13 = l2norm(vec_00,N);
      local_c8 = (-dVar13 * dVar13) / nlen;
    }
    if (0 < N) {
      uVar6 = 0;
      do {
        vec[uVar6] = jac[uVar6] / dx[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)N != uVar6);
    }
    dVar10 = -(nlen - dVar1) / local_c8;
    dVar3 = l2norm(vec,N);
    dVar3 = dVar3 / dVar1;
    uVar6 = (ulong)(uint)N;
    while( true ) {
      if ((dVar12 < dVar10) || (dVar3 < dVar12)) {
        dVar12 = dVar3 * dVar10;
        if (dVar12 < 0.0) {
          dVar12 = sqrt(dVar12);
        }
        else {
          dVar12 = SQRT(dVar12);
        }
        if (dVar12 <= dVar3 * 0.001) {
          dVar12 = dVar3 * 0.001;
        }
      }
      if (0 < N) {
        iVar5 = 0;
        uVar9 = 0;
        do {
          hess[iVar5] = dVar12 * dx[uVar9] * dx[uVar9] + hess[iVar5];
          uVar9 = uVar9 + 1;
          iVar5 = iVar5 + N + 1;
        } while (uVar6 != uVar9);
      }
      cholmod(hess,N,L,eps,0.0);
      scale(jac,1,N,-1.0);
      linsolve_lower(L,N,jac,step);
      scale(jac,1,N,-1.0);
      if (0 < N) {
        iVar5 = 0;
        uVar9 = 0;
        do {
          hess[iVar5] = dx[uVar9] * -dVar12 * dx[uVar9] + hess[iVar5];
          uVar9 = uVar9 + 1;
          iVar5 = iVar5 + N + 1;
        } while (uVar6 != uVar9);
      }
      if (0 < N) {
        uVar9 = 0;
        do {
          vec[uVar9] = step[uVar9] * dx[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      dVar4 = l2norm(vec,N);
      if (0 < N) {
        uVar9 = 0;
        do {
          vec[uVar9] = dx[uVar9] * vec[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      *vec_00 = *vec / *L;
      if (1 < N) {
        uVar9 = 1;
        pdVar7 = L + uVar6;
        do {
          dVar13 = 0.0;
          uVar8 = 0;
          do {
            dVar13 = dVar13 + vec_00[uVar8] * pdVar7[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
          vec_00[uVar9] = (vec[uVar9] - dVar13) / L[uVar9 * uVar6 + uVar9];
          uVar9 = uVar9 + 1;
          pdVar7 = pdVar7 + uVar6;
        } while (uVar9 != uVar6);
      }
      dVar13 = dVar4 - dVar1;
      dVar14 = l2norm(vec_00,N);
      dVar14 = (-dVar14 * dVar14) / dVar4;
      nlen = dVar1;
      if (0.0 <= dVar3 - dVar10 || dVar4 <= dVar1 * 1.5 && dVar1 * 0.75 <= dVar4) break;
      dVar11 = dVar12 - dVar13 / dVar14;
      uVar9 = -(ulong)(dVar10 <= dVar11);
      dVar10 = (double)(-(ulong)(dVar13 < 0.0) & (ulong)dVar12 |
                       ~-(ulong)(dVar13 < 0.0) & (~uVar9 & (ulong)dVar10 | (ulong)dVar11 & uVar9));
      dVar12 = dVar12 - (dVar4 * dVar13) / (dVar1 * dVar14);
    }
  }
  *ioval = nlen;
  ioval[1] = dVar12;
  ioval[2] = dVar2;
  ioval[3] = dVar13;
  ioval[4] = dVar14;
  ioval[5] = local_c8;
  free(vec);
  free(vec_00);
  return;
}

Assistant:

void trstep(double *jac,double *sN,int N,double * dx,double *L,double *hess,double nlen,double *ioval,double eps,
		double *step) {
	int i,c1,iter,j;
	double sum,tvec,l1,l2,maxadd,steplen;
	double hi,lo,lambdalo,lambdahi;
	double delta,lambda,deltaprev,phi,phid,phidinit;
	double *temp1,*temp2;
	
	hi = 1.5;lo = 0.75;
	delta = ioval[0];lambda = ioval[1]; deltaprev = ioval[2];
	phi = ioval[3]; phid = ioval[4] ; phidinit = ioval[5];
	temp1 = (double*) malloc(sizeof(double) *N);
	temp2 = (double*) malloc(sizeof(double) *N);
	
	if (nlen <= hi*delta) {
		ioval[6] = 1.0;
		for(i=0;i <N;++i) {
			step[i] = sN[i];
		}
		lambda = 0.;
		if (delta > nlen) {
			delta = nlen;
		}
		
	} else {
			ioval[6] = 0.0;
			if (lambda > 0.) {
				lambda -= (phi+deltaprev) * ((deltaprev - delta) + phi) /(delta * phid);
			}
			phi = nlen - delta;
			if (ioval[7] == 1.0) {
				ioval[7] = 0.0;
				for(i=0;i < N;++i) {
					temp1[i] = dx[i] * dx[i] * sN[i];
				}
				temp2[0] = temp1[0]/L[0];
				for(i = 1; i < N; ++i) {
					sum = 0.;
					c1 = i*N;
					for(j = 0; j < i; ++j) {
						sum += temp2[j] * L[c1 + j];
					}
					temp2[i] = (temp1[i] - sum)/L[c1+i];
				}
				tvec = l2norm(temp2,N);
				phidinit = - tvec*tvec/nlen;
			}
			lambdalo = - phi/phidinit;
			for(i=0;i < N;++i) {
				temp1[i] = jac[i]/dx[i];
			}
			tvec = l2norm(temp1,N);
			lambdahi = tvec / delta;
			iter = 0;
			while (iter == 0) {
				if (lambda < lambdalo || lambda > lambdahi) {
					l1 = sqrt(lambdalo * lambdahi);
					l2 = 0.001 *lambdahi;
					if (l1 > l2) {
						lambda = l1;
					} else {
						lambda = l2;
					}
				}
				
				for(i = 0; i < N;++i) {
					c1 = i*N;
					hess[c1+i] += lambda * dx[i] * dx[i];
				}
				maxadd = cholmod(hess,N,L,eps,0.0);
				scale(jac,1,N,-1.0);
				linsolve_lower(L,N,jac,step);
				scale(jac,1,N,-1.0);
				for(i = 0; i < N;++i) {
					c1 = i*N;
					hess[c1+i] -= lambda * dx[i] * dx[i];
				}
				for(i=0;i < N;++i) {
					temp1[i] = step[i] * dx[i];
				}
				steplen = l2norm(temp1,N);
				phi = steplen - delta;
				for(i=0;i < N;++i) {
					temp1[i] *= dx[i];
				}
				temp2[0] = temp1[0]/L[0];
				for(i = 1; i < N; ++i) {
					sum = 0.;
					c1 = i*N;
					for(j = 0; j < i; ++j) {
						sum += temp2[j] * L[c1 + j];
					}
					temp2[i] = (temp1[i] - sum)/L[c1+i];
				}
				tvec = l2norm(temp2,N);
				phid = - tvec*tvec/steplen;
				
				if ( (steplen >= lo * delta && steplen <= hi * delta ) || (lambdahi - lambdalo >= 0))  {
					iter = 1;
				} else {
					if (lambdalo <= lambda - (phi/phid)) {
						lambdalo = lambda - (phi/phid);
					}
					if (phi < 0) {
						lambdalo = lambda;
					}
					
					lambda -= (steplen *phi)/(delta*phid);
				}
				
			}
			
	}
	
	ioval[0] = delta;ioval[1] =lambda; ioval[2] = deltaprev;
	ioval[3] = phi; ioval[4] = phid ;ioval[5] = phidinit;
	
	free(temp1);
	free(temp2);
}